

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

int process_marker(jpeg *z,int m)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  int sizes [16];
  
  if (m == 0xc2) {
    failure_reason = "JPEG format not supported (progressive)";
    bVar9 = false;
    goto LAB_0014eb07;
  }
  if (m == 0xc4) {
    iVar1 = get16(&z->s);
    for (iVar1 = iVar1 + -2; 0 < iVar1; iVar1 = (iVar1 + -0x11) - uVar8) {
      uVar2 = get8(&z->s);
      if ((0x1f < (int)uVar2) || (uVar4 = uVar2 & 0xf, 3 < uVar4)) goto LAB_0014eae9;
      uVar8 = 0;
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
        iVar3 = get8(&z->s);
        sizes[lVar7] = iVar3;
        uVar8 = uVar8 + iVar3;
      }
      if (uVar2 < 0x10) {
        iVar3 = build_huffman(z->huff_dc + uVar4,sizes);
        lVar7 = 0x28;
      }
      else {
        iVar3 = build_huffman(z->huff_ac + uVar4,sizes);
        lVar7 = 0x1a68;
      }
      if (iVar3 == 0) goto LAB_0014eaf7;
      uVar5 = 0;
      if (0 < (int)uVar8) {
        uVar5 = (ulong)uVar8;
      }
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        iVar3 = get8(&z->s);
        z->huff_dc[uVar4].values[uVar6 + lVar7 + -0x28] = (uint8)iVar3;
      }
    }
  }
  else {
    if (m != 0xdb) {
      if (m == 0xdd) {
        iVar1 = get16(&z->s);
        if (iVar1 == 4) {
          iVar1 = get16(&z->s);
          z->restart_interval = iVar1;
LAB_0014ea82:
          bVar9 = true;
          goto LAB_0014eb07;
        }
LAB_0014eae9:
        failure_reason = "Corrupt JPEG";
      }
      else {
        if (m == 0xff) goto LAB_0014eae9;
        if (m == 0xfe || (m & 0xfffffff0U) == 0xe0) {
          iVar1 = get16(&z->s);
          skip(&z->s,iVar1 + -2);
          goto LAB_0014ea82;
        }
      }
LAB_0014eaf7:
      bVar9 = false;
      goto LAB_0014eb07;
    }
    iVar1 = get16(&z->s);
    for (iVar1 = iVar1 + -2; 0 < iVar1; iVar1 = iVar1 + -0x41) {
      uVar2 = get8(&z->s);
      if ((0xf < uVar2) || (3 < (uVar2 & 0xf))) goto LAB_0014eae9;
      for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 1) {
        iVar3 = get8(&z->s);
        z->dequant[0][(ulong)""[lVar7] + (ulong)((uVar2 & 0xf) << 6)] = (uint8)iVar3;
      }
    }
  }
  bVar9 = iVar1 == 0;
LAB_0014eb07:
  return (int)bVar9;
}

Assistant:

static int process_marker(jpeg *z, int m)
{
   int L;
   switch (m) {
      case MARKER_none: // no marker found
         return e("expected marker","Corrupt JPEG");

      case 0xC2: // SOF - progressive
         return e("progressive jpeg","JPEG format not supported (progressive)");

      case 0xDD: // DRI - specify restart interval
         if (get16(&z->s) != 4) return e("bad DRI len","Corrupt JPEG");
         z->restart_interval = get16(&z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = get16(&z->s)-2;
         while (L > 0) {
            int q = get8(&z->s);
            int p = q >> 4;
            int t = q & 15,i;
            if (p != 0) return e("bad DQT type","Corrupt JPEG");
            if (t > 3) return e("bad DQT table","Corrupt JPEG");
            for (i=0; i < 64; ++i)
               z->dequant[t][dezigzag[i]] = get8u(&z->s);
            #if STBI_SIMD
            for (i=0; i < 64; ++i)
               z->dequant2[t][i] = dequant[t][i];
            #endif
            L -= 65;
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = get16(&z->s)-2;
         while (L > 0) {
            uint8 *v;
            int sizes[16],i,m=0;
            int q = get8(&z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return e("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = get8(&z->s);
               m += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < m; ++i)
               v[i] = get8u(&z->s);
            L -= m;
         }
         return L==0;
   }
   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      skip(&z->s, get16(&z->s)-2);
      return 1;
   }
   return 0;
}